

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::FenceVkImpl::Wait(FenceVkImpl *this,Uint64 Value)

{
  atomic<unsigned_long> *paVar1;
  VulkanLogicalDevice *this_00;
  _Elt_pointer pSVar2;
  ulong uVar3;
  ulong uVar4;
  Uint64 UVar5;
  VkResult VVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  VkSemaphoreWaitInfo WaitInfo;
  string msg;
  Uint64 local_80;
  undefined1 local_78 [32];
  Uint64 *local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_80 = Value;
  if ((this->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
    iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->m_SyncPointsGuard);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
    }
    this_00 = (((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
               .m_pDevice)->m_LogicalVkDevice).
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    do {
      UVar5 = local_80;
      pSVar2 = (this->m_SyncPoints).
               super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (((this->m_SyncPoints).
           super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur == pSVar2) ||
         (uVar3 = pSVar2->Value, local_80 < uVar3)) break;
      local_50._0_8_ =
           (((pSVar2->SyncPoint).
             super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_Fence)
           .m_VkSyncObject;
      VVar6 = VulkanUtilities::VulkanLogicalDevice::GetFenceStatus(this_00,(VkFence)local_50._0_8_);
      if (VVar6 == VK_NOT_READY) {
        VVar6 = VulkanUtilities::VulkanLogicalDevice::WaitForFences
                          (this_00,1,(VkFence *)local_50,1,0xffffffffffffffff);
      }
      if (VVar6 != VK_SUCCESS) {
        FormatString<char[41]>
                  ((string *)local_78,(char (*) [41])"All pending fences must now be complete!");
        DebugAssertionFailed
                  ((Char *)local_78._0_8_,"Wait",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                   ,0xe4);
        if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        }
      }
      uVar4 = pSVar2->Value;
      uVar8 = (this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue.
              super___atomic_base<unsigned_long>._M_i;
      do {
        uVar10 = uVar4;
        if (uVar4 < uVar8) {
          uVar10 = uVar8;
        }
        paVar1 = &(this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue;
        LOCK();
        uVar9 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
        bVar11 = uVar8 == uVar9;
        if (bVar11) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = uVar10;
          uVar9 = uVar8;
        }
        UNLOCK();
        uVar8 = uVar9;
      } while (!bVar11);
      std::
      deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
      ::pop_front(&this->m_SyncPoints);
    } while (uVar3 <= UVar5);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_SyncPointsGuard);
  }
  else {
    local_78._0_8_ = (pointer)0x3b9df29c;
    local_78._8_8_ = (void *)0x0;
    local_78._16_8_ = 0x100000000;
    local_78._24_8_ = &(this->m_TimelineSemaphore).m_VkObject;
    local_58 = &local_80;
    VVar6 = VulkanUtilities::VulkanLogicalDevice::WaitSemaphores
                      ((((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                        .m_pDevice)->m_LogicalVkDevice).
                       super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(VkSemaphoreWaitInfo *)local_78,0xffffffffffffffff);
    if (VVar6 != VK_SUCCESS) {
      FormatString<char[34]>((string *)local_50,(char (*) [34])"Failed to wait timeline semaphore");
      DebugAssertionFailed
                ((Char *)local_50._0_8_,"Wait",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0xd0);
      if ((VkFence)local_50._0_8_ != (VkFence)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void FenceVkImpl::Wait(Uint64 Value)
{
    if (IsTimelineSemaphore())
    {
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

        VkSemaphoreWaitInfo WaitInfo{};
        WaitInfo.sType          = VK_STRUCTURE_TYPE_SEMAPHORE_WAIT_INFO;
        WaitInfo.pNext          = nullptr;
        WaitInfo.flags          = 0;
        WaitInfo.semaphoreCount = 1;
        WaitInfo.pSemaphores    = &m_TimelineSemaphore;
        WaitInfo.pValues        = &Value;

        VkResult err = LogicalDevice.WaitSemaphores(WaitInfo, UINT64_MAX);
        DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to wait timeline semaphore");
    }
    else
    {
        std::lock_guard<std::mutex> Lock{m_SyncPointsGuard};

        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();
        while (!m_SyncPoints.empty())
        {
            SyncPointData& Item = m_SyncPoints.front();
            if (Item.Value > Value)
                break;

            VkFence  Fence  = Item.SyncPoint->GetFence();
            VkResult status = LogicalDevice.GetFenceStatus(Fence);
            if (status == VK_NOT_READY)
            {
                status = LogicalDevice.WaitForFences(1, &Fence, VK_TRUE, UINT64_MAX);
            }

            DEV_CHECK_ERR(status == VK_SUCCESS, "All pending fences must now be complete!");
            UpdateLastCompletedFenceValue(Item.Value);

            m_SyncPoints.pop_front();
        }
    }
}